

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O1

type __thiscall
itlib::
flat_map<unsigned_long,unsigned_long,itlib::fmimpl::less,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
::operator[]<unsigned_long&>
          (flat_map<unsigned_long,unsigned_long,itlib::fmimpl::less,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
           *this,unsigned_long *k)

{
  iterator __position;
  unsigned_long local_18;
  
  __position = flat_map<unsigned_long,_unsigned_long,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::lower_bound<unsigned_long>
                         ((flat_map<unsigned_long,_unsigned_long,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                           *)this,k);
  if ((__position._M_current == *(pair<unsigned_long,_unsigned_long> **)(this + 8)) ||
     (*k < (__position._M_current)->first)) {
    local_18 = 0;
    __position._M_current =
         (pair<unsigned_long,_unsigned_long> *)
         std::
         vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
         ::_M_emplace_aux<unsigned_long&,unsigned_long>
                   ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                     *)this,__position._M_current,k,&local_18);
  }
  return &(__position._M_current)->second;
}

Assistant:

typename std::enable_if<std::is_constructible<key_type, K>::value,
    mapped_type&>::type operator[](K&& k)
    {
        auto i = lower_bound(k);
        if (i != end() && !cmp()(k, *i))
        {
            return i->second;
        }

        i = m_container.emplace(i, std::forward<K>(k), mapped_type());
        return i->second;
    }